

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.c
# Opt level: O3

void witness_depth_error_impl(witness_list_t *witnesses,witness_rank_t rank_inclusive,uint depth)

{
  witness_t *pwVar1;
  char *pcVar2;
  
  pcVar2 = "s";
  if (depth == 1) {
    pcVar2 = "";
  }
  malloc_printf("<jemalloc>: Should own %u lock%s of rank >= %u:",(ulong)depth,pcVar2,rank_inclusive
               );
  pwVar1 = witnesses->qlh_first;
  do {
    if (pwVar1 == (witness_t *)0x0) break;
    malloc_printf(" %s(%u)",pwVar1->name,(ulong)pwVar1->rank);
    pwVar1 = (pwVar1->link).qre_next;
  } while (pwVar1 != witnesses->qlh_first);
  malloc_printf("\n");
  abort();
}

Assistant:

static void
witness_depth_error_impl(const witness_list_t *witnesses,
    witness_rank_t rank_inclusive, unsigned depth) {
	witness_t *w;

	malloc_printf("<jemalloc>: Should own %u lock%s of rank >= %u:", depth,
	    (depth != 1) ?  "s" : "", rank_inclusive);
	ql_foreach(w, witnesses, link) {
		malloc_printf(" %s(%u)", w->name, w->rank);
	}
	malloc_printf("\n");
	abort();
}